

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_impl.c
# Opt level: O0

int loader_impl_initialize(plugin_manager manager,plugin p,loader_impl impl)

{
  int iVar1;
  value pvVar2;
  undefined8 *puVar3;
  undefined8 uVar4;
  char *pcVar5;
  char *pcVar6;
  void *pvVar7;
  size_t sVar8;
  vector v;
  plugin p_00;
  loader_impl impl_00;
  value in_RDX;
  plugin in_RSI;
  plugin_manager in_RDI;
  char *path_1;
  size_t size_1;
  size_t iterator_1;
  char *path;
  size_t size;
  size_t iterator;
  vector paths;
  vector script_paths;
  char *library_path;
  value loader_library_path_value;
  loader_impl in_stack_00000fb8;
  loader_impl_interface in_stack_00000fc0;
  set in_stack_ffffffffffffff68;
  configuration in_stack_ffffffffffffff70;
  configuration in_stack_ffffffffffffff78;
  plugin in_stack_ffffffffffffff80;
  set in_stack_ffffffffffffff88;
  loader_impl in_stack_ffffffffffffff90;
  plugin in_stack_ffffffffffffff98;
  plugin local_60;
  ulong local_48;
  set local_30;
  value local_28;
  int local_4;
  
  local_28 = (value)0x0;
  if (*(int *)((long)in_RDX + 8) == 0) {
    local_4 = 0;
  }
  else {
    local_30 = (set)plugin_manager_library_path(in_RDI);
    if ((*(long *)((long)in_RDX + 0x50) != 0) &&
       (pvVar2 = configuration_value_type
                           (in_stack_ffffffffffffff78,(char *)in_stack_ffffffffffffff70,
                            (type_id)((ulong)in_stack_ffffffffffffff68 >> 0x20)),
       pvVar2 == (value)0x0)) {
      in_stack_ffffffffffffff88 = local_30;
      strnlen((char *)local_30,0x1000);
      local_28 = value_create_string((char *)in_stack_ffffffffffffff70,
                                     (size_t)in_stack_ffffffffffffff68);
      configuration_define
                (in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68,(value)0x13021c);
    }
    puVar3 = (undefined8 *)plugin_iface(in_RSI);
    uVar4 = (*(code *)*puVar3)(in_RDX,*(undefined8 *)((long)in_RDX + 0x50));
    *(undefined8 *)((long)in_RDX + 0x28) = uVar4;
    if ((*(long *)((long)in_RDX + 0x50) != 0) && (local_28 != (value)0x0)) {
      configuration_undefine(in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68);
      value_type_destroy(in_RDX);
    }
    if (*(long *)((long)in_RDX + 0x28) == 0) {
      pcVar5 = plugin_name(in_RSI);
      log_write_impl_va("metacall",0x1b2,"loader_impl_initialize",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loader/source/loader_impl.c"
                        ,LOG_LEVEL_ERROR,"Loader (%s) returned NULL value on the initialization",
                        pcVar5);
      local_4 = 1;
    }
    else {
      iVar1 = loader_impl_initialize_registered
                        ((plugin_manager)in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
      if (iVar1 == 0) {
        *(undefined4 *)((long)in_RDX + 8) = 0;
        if (*(long *)((long)in_RDX + 0x50) != 0) {
          plugin_iface(in_RSI);
          loader_impl_configuration_execution_paths(in_stack_00000fc0,in_stack_00000fb8);
        }
        pvVar2 = configuration_value_type
                           (in_stack_ffffffffffffff78,(char *)in_stack_ffffffffffffff70,
                            (type_id)((ulong)in_stack_ffffffffffffff68 >> 0x20));
        if (pvVar2 != (value)0x0) {
          local_30 = (set)value_to_string((value)0x1303be);
        }
        iVar1 = loader_impl_execution_path
                          (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                           (char *)in_stack_ffffffffffffff88);
        if (iVar1 != 0) {
          log_write_impl_va("metacall",0x1d7,"loader_impl_initialize",
                            "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loader/source/loader_impl.c"
                            ,LOG_LEVEL_ERROR,"Error when loading path %s");
          in_stack_ffffffffffffff68 = local_30;
        }
        pvVar7 = plugin_manager_impl(in_RDI);
        if (*(vector *)((long)pvVar7 + 0x18) != (vector)0x0) {
          sVar8 = vector_size(*(vector *)((long)pvVar7 + 0x18));
          for (local_48 = 0; local_48 < sVar8; local_48 = local_48 + 1) {
            puVar3 = (undefined8 *)vector_at((vector)in_stack_ffffffffffffff68,0x13046f);
            uVar4 = *puVar3;
            iVar1 = loader_impl_execution_path
                              (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                               (char *)in_stack_ffffffffffffff88);
            if (iVar1 != 0) {
              in_stack_ffffffffffffff68 = (set)plugin_name(in_RSI);
              log_write_impl_va("metacall",0x1e7,"loader_impl_initialize",
                                "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loader/source/loader_impl.c"
                                ,LOG_LEVEL_ERROR,"Loader (%s) failed to define execution path: %s",
                                in_stack_ffffffffffffff68,uVar4);
            }
          }
        }
        plugin_name(in_RSI);
        v = (vector)set_get(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
        if (v != (vector)0x0) {
          p_00 = (plugin)vector_size(v);
          for (local_60 = (plugin)0x0; local_60 < p_00;
              local_60 = (plugin)((long)&local_60->name + 1)) {
            impl_00 = (loader_impl)vector_at((vector)in_stack_ffffffffffffff68,0x130566);
            iVar1 = loader_impl_execution_path(p_00,impl_00,(char *)in_stack_ffffffffffffff88);
            if (iVar1 != 0) {
              in_stack_ffffffffffffff68 = (set)plugin_name(in_RSI);
              log_write_impl_va("metacall",0x1f9,"loader_impl_initialize",
                                "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loader/source/loader_impl.c"
                                ,LOG_LEVEL_ERROR,"Loader (%s) failed to load path: %s",
                                in_stack_ffffffffffffff68,impl_00);
            }
          }
        }
        local_4 = 0;
      }
      else {
        pcVar5 = plugin_name(in_RSI);
        pcVar6 = plugin_name(in_RSI);
        log_write_impl_va("metacall",0x1bc,"loader_impl_initialize",
                          "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loader/source/loader_impl.c"
                          ,LOG_LEVEL_ERROR,
                          "Loader (%s) was not registered in the initialization list, in order to solve this problem it must call to the function \'loader_initialization_register\' at the end of the initialization (i.e %s_loader_impl_initialize)"
                          ,pcVar5,pcVar6);
        local_4 = 1;
      }
    }
  }
  return local_4;
}

Assistant:

int loader_impl_initialize(plugin_manager manager, plugin p, loader_impl impl)
{
	static const char loader_library_path[] = "loader_library_path";
	value loader_library_path_value = NULL;
	char *library_path = NULL;
	vector script_paths, paths;

	if (impl->init == 0)
	{
		return 0;
	}

	/* Retrieve the library path */
	library_path = plugin_manager_library_path(manager);

	/* The library path priority order is the following:
	* 1) In the configuration <tag>_loader.json, the flag loader_library_path.
	* 2) The environment variable LOADER_LIBRARY_PATH.
	* 3) The directory of the path of (lib)metacall.{so,dll,dylib,...}
	* 4) Default install paths defined at compile time.
	*/

	/* Check if the configuration has a custom loader_library_path, otherwise set it up */
	if (impl->config != NULL && configuration_value_type(impl->config, loader_library_path, TYPE_STRING) == NULL)
	{
		loader_library_path_value = value_create_string(library_path, strnlen(library_path, LOADER_PATH_SIZE));
		configuration_define(impl->config, loader_library_path, loader_library_path_value);
	}

	/* Call to the loader initialize method */
	impl->data = loader_iface(p)->initialize(impl, impl->config);

	/* Undefine the library path field from config */
	if (impl->config != NULL && loader_library_path_value != NULL)
	{
		configuration_undefine(impl->config, loader_library_path);
		value_type_destroy(loader_library_path_value);
	}

	/* Verify that it the loader returned valid data on initialization */
	if (impl->data == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Loader (%s) returned NULL value on the initialization", plugin_name(p));
		return 1;
	}

	/* Verify that the loader has been registered into the initialization list */
	if (loader_impl_initialize_registered(manager, p) != 0)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Loader (%s) was not registered in the initialization list, "
											   "in order to solve this problem it must call to the function 'loader_initialization_register' "
											   "at the end of the initialization (i.e %s_loader_impl_initialize)",
			plugin_name(p), plugin_name(p));
		return 1;
	}

	impl->init = 0;

	if (impl->config != NULL)
	{
		loader_impl_configuration_execution_paths(loader_iface(p), impl);
	}

	/* The scripts path priority order is the following:
	* 1) The library path.
	* 2) The delimiter based paths defined in LOADER_SCRIPT_PATH.
	* 3) The execution paths defined before the initialization of a loader (for example, all metacall_execution_path(...) called before metacall_load_from_file(...)).
	*/

	/* Load the library path as execution path */
	loader_library_path_value = configuration_value_type(impl->config, loader_library_path, TYPE_STRING);

	if (loader_library_path_value != NULL)
	{
		library_path = value_to_string(loader_library_path_value);
	}

	if (loader_impl_execution_path(p, impl, library_path) != 0)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Error when loading path %s", library_path);
	}

	script_paths = plugin_manager_impl_type(manager, loader_manager_impl)->script_paths;

	/* Load the list of script paths (this allows to load multiple paths with a delimiter) */
	if (script_paths != NULL)
	{
		size_t iterator, size = vector_size(script_paths);

		for (iterator = 0; iterator < size; ++iterator)
		{
			char *path = vector_at_type(script_paths, iterator, char *);

			if (loader_impl_execution_path(p, impl, path) != 0)
			{
				log_write("metacall", LOG_LEVEL_ERROR, "Loader (%s) failed to define execution path: %s", plugin_name(p), path);
			}
		}
	}

	paths = set_get(impl->exec_path_map, (const set_key)plugin_name(p));

	/* Load all execution paths (those are the delayed loading for the paths that has been defined before initializing the loader) */
	if (paths != NULL)
	{
		size_t iterator, size = vector_size(paths);

		for (iterator = 0; iterator < size; ++iterator)
		{
			char *path = vector_at(paths, iterator);

			if (loader_impl_execution_path(p, impl, path) != 0)
			{
				log_write("metacall", LOG_LEVEL_ERROR, "Loader (%s) failed to load path: %s", plugin_name(p), path);
			}
		}
	}

	return 0;
}